

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_BadPackageName_Test::
~FeaturesTest_BadPackageName_Test(FeaturesTest_BadPackageName_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest((ValidationErrorTest *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, BadPackageName) {
  BuildDescriptorMessagesInTestPool();

  pool_.EnforceNamingStyle(true);

  ParseAndBuildFileWithErrorSubstr(
      "naming1.proto", R"schema(
      edition = "2024";
      package bad.Package.name;
      )schema",
      "Package name bad.Package.name should be lower_snake_case");

  ParseAndBuildFileWithErrorSubstr(
      "naming2.proto", R"schema(
      edition = "2024";
      package bad_____underscores;
      )schema",
      "Package name bad_____underscores contains style violating underscores");
}